

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

void Scl_LibertyDumpTables(Vec_Str_t *vOut,Vec_Flt_t *vInd1,Vec_Flt_t *vInd2,Vec_Flt_t *vValues)

{
  int iVar1;
  int i;
  bool bVar2;
  float fVar3;
  
  Vec_StrPutI_(vOut,vInd1->nSize);
  for (iVar1 = 0; iVar1 < vInd1->nSize; iVar1 = iVar1 + 1) {
    fVar3 = Vec_FltEntry(vInd1,iVar1);
    Vec_StrPutF_(vOut,fVar3);
  }
  Vec_StrPutI_(vOut,vInd2->nSize);
  for (iVar1 = 0; iVar1 < vInd2->nSize; iVar1 = iVar1 + 1) {
    fVar3 = Vec_FltEntry(vInd2,iVar1);
    Vec_StrPutF_(vOut,fVar3);
  }
  iVar1 = vInd2->nSize * vInd1->nSize;
  if (iVar1 == vValues->nSize) {
    for (i = 0; i < iVar1; i = i + 1) {
      fVar3 = Vec_FltEntry(vValues,i);
      Vec_StrPutF_(vOut,fVar3);
      iVar1 = vValues->nSize;
    }
    iVar1 = 3;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      Vec_StrPutF_(vOut,0.0);
    }
    iVar1 = 4;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      Vec_StrPutF_(vOut,0.0);
    }
    iVar1 = 6;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      Vec_StrPutF_(vOut,0.0);
    }
    return;
  }
  __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x3e6,
                "void Scl_LibertyDumpTables(Vec_Str_t *, Vec_Flt_t *, Vec_Flt_t *, Vec_Flt_t *)");
}

Assistant:

void Scl_LibertyDumpTables( Vec_Str_t * vOut, Vec_Flt_t * vInd1, Vec_Flt_t * vInd2, Vec_Flt_t * vValues )
{
    int i; float Entry;
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
    Vec_FltForEachEntry( vInd1, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    // write entries
    Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
    Vec_FltForEachEntry( vInd2, Entry, i )
        Vec_StrPutF_( vOut, Entry );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    // write entries
    assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
    Vec_FltForEachEntry( vValues, Entry, i )
    {
        Vec_StrPutF_( vOut, Entry );
        if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
            Vec_StrPut_( vOut );
    }
    // dump approximations
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
}